

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_NtkRunEco(char **pFileNames,int fCheck,int fRandom,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Acb_Ntk_t *pNtkF;
  Acb_Ntk_t *pNtkG;
  Abc_Frame_t *pAbc;
  char *pcVar2;
  long lVar3;
  char Command [1000];
  char local_418 [1000];
  
  pNtkF = Acb_VerilogSimpleRead(*pFileNames,pFileNames[2]);
  pNtkG = Acb_VerilogSimpleRead(pFileNames[1],(char *)0x0);
  if (pNtkG != (Acb_Ntk_t *)0x0 && pNtkF != (Acb_Ntk_t *)0x0) {
    if (fRandom != 0) {
      printf("Permuting targets as follows:   ");
      Vec_IntPermute(&pNtkF->vTargets);
      printf("Vector has %d entries: {",(ulong)(uint)(pNtkF->vTargets).nSize);
      if (0 < (pNtkF->vTargets).nSize) {
        lVar3 = 0;
        do {
          printf(" %d",(ulong)(uint)(pNtkF->vTargets).pArray[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (pNtkF->vTargets).nSize);
      }
      puts(" }");
    }
    if ((pNtkF->vCis).nSize != (pNtkG->vCis).nSize) {
      __assert_fail("Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0xb17,"void Acb_NtkRunEco(char **, int, int, int, int)");
    }
    if ((pNtkF->vCos).nSize != (pNtkG->vCos).nSize) {
      __assert_fail("Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0xb18,"void Acb_NtkRunEco(char **, int, int, int, int)");
    }
    Acb_IntallLibrary();
    iVar1 = Acb_NtkEcoPerform(pNtkF,pNtkG,pFileNames,0,fCheck,fVerbose,fVeryVerbose);
    if (iVar1 == 0) {
      puts("Computation did not succeed.");
      Acb_ManFree(pNtkF->pDesign);
      Acb_ManFree(pNtkG->pDesign);
      pcVar2 = "out.v";
      if (pFileNames[3] != (char *)0x0) {
        pcVar2 = pFileNames[3];
      }
      sprintf(local_418,
              "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig"
              ,pFileNames[1],pcVar2);
    }
    else {
      Acb_ManFree(pNtkF->pDesign);
      Acb_ManFree(pNtkG->pDesign);
      pcVar2 = "out.v";
      if (pFileNames[3] != (char *)0x0) {
        pcVar2 = pFileNames[3];
      }
      sprintf(local_418,
              "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig"
              ,pFileNames[1],pcVar2);
      pAbc = Abc_FrameGetGlobalFrame();
      iVar1 = Cmd_CommandExecute(pAbc,local_418);
      if (iVar1 != 0) {
        fprintf(_stdout,"Cannot execute command \"%s\".\n",local_418);
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void Acb_NtkRunEco( char * pFileNames[4], int fCheck, int fRandom, int fVerbose, int fVeryVerbose )
{
    char Command[1000]; int Result = 1;
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNames[0], pFileNames[2] );
    Acb_Ntk_t * pNtkG = Acb_VerilogSimpleRead( pFileNames[1], NULL );
    if ( !pNtkF || !pNtkG )
        return;
    //int * pArray = Vec_IntArray( &pNtkF->vTargets );
    //ABC_SWAP( int, pArray[7], pArray[4] );
    //Vec_IntReverseOrder( &pNtkF->vTargets );
    if ( fRandom )
    {
        printf( "Permuting targets as follows:   " );
        Vec_IntPermute( &pNtkF->vTargets );
        Vec_IntPrint( &pNtkF->vTargets );
    }
        
    assert( Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG) );
    assert( Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG) );

    Acb_IntallLibrary();

    if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 0, fCheck, fVerbose, fVeryVerbose ) )
    {
//        printf( "General computation timed out. Trying inputs only.\n\n" );
//        if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 1, fCheck, fVerbose, fVeryVerbose ) )
//            printf( "Input-only computation also timed out.\n\n" );
        printf( "Computation did not succeed.\n" );
        Result = 0;
    }

    Acb_ManFree( pNtkF->pDesign );
    Acb_ManFree( pNtkG->pDesign );

    // verify the result
    sprintf( Command, "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig", 
        pFileNames[1], pFileNames[3] ? pFileNames[3] : "out.v" );
    if ( Result && Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command ) )
        fprintf( stdout, "Cannot execute command \"%s\".\n", Command );
    printf( "\n" );
}